

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall
APITests::_test_events
          (APITests *this,int init,Edge edge,
          vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *tests,
          bool specify_callback,bool use_add_callback)

{
  bool bVar1;
  undefined8 in_RCX;
  Edge in_EDX;
  int in_ESI;
  uint uVar2;
  string *in_RDI;
  byte in_R8B;
  byte in_R9B;
  bool *event_expected;
  int *output;
  pair<int,_bool> *pair;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *__range1;
  anon_class_32_4_ee1f9acd get_saw_event;
  TestCallback callback;
  bool event_callback_occurred;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  Callback *in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  int iVar3;
  string *psVar4;
  undefined1 local_201 [40];
  allocator local_1d9;
  string local_1d8 [32];
  bool *local_1b8;
  reference local_1b0;
  reference local_1a8;
  pair<int,_bool> *local_1a0;
  __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
  local_198;
  undefined8 local_190;
  allocator local_181;
  string local_180 [32];
  Callback local_160;
  undefined8 local_120;
  Callback local_118;
  Callback local_d8;
  byte *local_98;
  byte *local_90;
  undefined1 *local_88;
  string local_68 [77];
  undefined1 local_1b;
  byte local_1a;
  byte local_19;
  undefined8 local_18;
  Edge local_10;
  int local_c;
  
  local_19 = in_R8B & 1;
  local_1a = in_R9B & 1;
  local_1b = 0;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  GPIO::setmode(BOARD);
  iVar3 = (int)((ulong)in_RCX >> 0x20);
  GPIO::setup(*(int *)(in_RDI + 0x20),OUT,local_c);
  GPIO::setup(*(int *)(in_RDI + 0x24),IN,-1);
  psVar4 = local_68;
  std::__cxx11::to_string(iVar3);
  TestCallback::TestCallback
            ((TestCallback *)in_stack_fffffffffffffd90,
             (bool *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (string *)0x143b88);
  std::__cxx11::string::~string(local_68);
  local_98 = &local_19;
  local_90 = &local_1a;
  local_88 = &local_1b;
  if ((local_19 & 1) == 0) {
    iVar3 = *(int *)(in_RDI + 0x24);
    local_120 = 0;
    GPIO::Callback::Callback<decltype(nullptr)>
              (in_stack_fffffffffffffd90,
               (void **)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    GPIO::add_event_detect(iVar3,local_10,&local_118,0);
    uVar2 = (uint)&local_118;
    GPIO::Callback::~Callback(in_stack_fffffffffffffd90);
  }
  else {
    iVar3 = *(int *)(in_RDI + 0x24);
    GPIO::Callback::Callback<TestCallback&>
              (in_stack_fffffffffffffd90,
               (TestCallback *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    GPIO::add_event_detect(iVar3,local_10,&local_d8,0);
    uVar2 = (uint)&local_d8;
    GPIO::Callback::~Callback(in_stack_fffffffffffffd90);
  }
  if ((local_1a & 1) != 0) {
    iVar3 = *(int *)(in_RDI + 0x24);
    GPIO::Callback::Callback<TestCallback&>
              (in_stack_fffffffffffffd90,
               (TestCallback *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    GPIO::add_event_callback(iVar3,&local_160);
    uVar2 = (uint)&local_160;
    GPIO::Callback::~Callback(in_stack_fffffffffffffd90);
  }
  sleep(uVar2);
  _test_events::anon_class_32_4_ee1f9acd::operator()
            ((anon_class_32_4_ee1f9acd *)
             CONCAT17(in_stack_fffffffffffffd9f,
                      CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"",&local_181);
  assert::is_true(SUB81((ulong)psVar4 >> 0x38,0),in_RDI);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  local_190 = local_18;
  local_198._M_current =
       (pair<int,_bool> *)
       std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::begin
                 ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                  CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  local_1a0 = (pair<int,_bool> *)
              std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::end
                        ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                         CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)in_stack_fffffffffffffd90,
                       (__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    if (!bVar1) break;
    local_1b0 = __gnu_cxx::
                __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                ::operator*(&local_198);
    local_1b8 = &local_1b0->second;
    uVar2 = *(uint *)(in_RDI + 0x20);
    local_1a8 = local_1b0;
    GPIO::output(uVar2,local_1b0->first);
    sleep(uVar2);
    bVar1 = _test_events::anon_class_32_4_ee1f9acd::operator()
                      ((anon_class_32_4_ee1f9acd *)
                       CONCAT17(in_stack_fffffffffffffd9f,
                                CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
    in_stack_fffffffffffffd9f = bVar1 == (bool)(*local_1b8 & 1U);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"",&local_1d9);
    assert::is_true(SUB81((ulong)psVar4 >> 0x38,0),in_RDI);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    in_stack_fffffffffffffd9e =
         _test_events::anon_class_32_4_ee1f9acd::operator()
                   ((anon_class_32_4_ee1f9acd *)
                    CONCAT17(in_stack_fffffffffffffd9f,
                             CONCAT16(in_stack_fffffffffffffd9e,in_stack_fffffffffffffd98)));
    in_stack_fffffffffffffd8f = !(bool)in_stack_fffffffffffffd9e;
    in_stack_fffffffffffffd90 = (Callback *)local_201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_201 + 1),"",(allocator *)in_stack_fffffffffffffd90);
    assert::is_true(SUB81((ulong)psVar4 >> 0x38,0),in_RDI);
    std::__cxx11::string::~string((string *)(local_201 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_201);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
    ::operator++(&local_198);
  }
  GPIO::remove_event_detect(*(int *)(in_RDI + 0x24));
  GPIO::cleanup();
  TestCallback::~TestCallback((TestCallback *)0x1440ef);
  return;
}

Assistant:

void _test_events(int init, GPIO::Edge edge, const std::vector<std::pair<int, bool>>& tests, bool specify_callback,
                      bool use_add_callback)
    {
        bool event_callback_occurred = false;

        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, init);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        TestCallback callback(&event_callback_occurred, std::to_string(pin_data.in_a));

        auto get_saw_event = [&]() mutable -> bool
        {
            if (specify_callback || use_add_callback)
            {
                bool val = event_callback_occurred;
                event_callback_occurred = false;
                return val;
            }

            return GPIO::event_detected(pin_data.in_a);
        };

        if (specify_callback)
            GPIO::add_event_detect(pin_data.in_a, edge, callback);
        else
            GPIO::add_event_detect(pin_data.in_a, edge);

        if (use_add_callback)
            GPIO::add_event_callback(pin_data.in_a, callback);

        sleep(0.1);
        assert::is_true(!get_saw_event());

        for (auto& pair : tests)
        {
            auto& output = pair.first;
            auto& event_expected = pair.second;

            GPIO::output(pin_data.out_a, output);
            sleep(0.1);
            assert::is_true(get_saw_event() == event_expected);
            assert::is_true(!get_saw_event());
        }

        GPIO::remove_event_detect(pin_data.in_a);
        GPIO::cleanup();
    }